

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::draw_halfedge_arrow(Mesh *this,Halfedge *h)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  DrawStyle *pDVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  Vector3D local_88;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  pDVar8 = get_draw_style(this,&h->super_HalfedgeElement);
  DrawStyle::style_halfedge(pDVar8);
  p_Var2 = (h->_next)._M_node;
  p_Var3 = (h->_vertex)._M_node;
  p_Var4 = p_Var2[2]._M_prev;
  p_Var5 = p_Var2[2]._M_next[2]._M_prev;
  p_Var2 = p_Var4[2]._M_prev;
  p_Var1 = p_Var3[2]._M_prev;
  dVar11 = (((double)p_Var2 - (double)p_Var1) - ((double)p_Var1 - (double)p_Var5[2]._M_prev)) * 0.5
           * 0.2 + (double)p_Var1;
  p_Var6 = p_Var4[1]._M_prev;
  p_Var4 = p_Var4[2]._M_next;
  p_Var7 = p_Var3[1]._M_prev;
  p_Var3 = p_Var3[2]._M_next;
  dVar17 = (((double)p_Var6 - (double)p_Var7) - ((double)p_Var7 - (double)p_Var5[1]._M_prev)) * 0.5
           * 0.2 + (double)p_Var7;
  dStack_40 = (((double)p_Var4 - (double)p_Var3) - ((double)p_Var3 - (double)p_Var5[2]._M_next)) *
              0.5 * 0.2 + (double)p_Var3;
  dVar14 = (((double)p_Var5[2]._M_prev - (double)p_Var2) - ((double)p_Var2 - (double)p_Var1)) * 0.5
           * 0.2 + (double)p_Var2;
  dVar15 = (((double)p_Var5[1]._M_prev - (double)p_Var6) - ((double)p_Var6 - (double)p_Var7)) * 0.5
           * 0.2 + (double)p_Var6;
  dVar16 = (((double)p_Var5[2]._M_next - (double)p_Var4) - ((double)p_Var4 - (double)p_Var3)) * 0.5
           * 0.2 + (double)p_Var4;
  dVar9 = (dVar16 - dStack_40) * 0.2;
  local_68 = dVar15;
  dStack_60 = dVar16;
  local_58 = dVar14;
  local_48 = dVar17;
  local_38 = dVar11;
  Face::normal(&local_88,(Face *)((h->_face)._M_node + 1));
  dVar10 = (dVar14 - dVar11) * 0.2;
  dVar17 = (dVar15 - dVar17) * 0.2;
  dVar12 = dVar17 * local_88.y;
  dVar13 = dVar10 * local_88.x;
  dVar11 = local_88.x * dVar9;
  local_88.x = (local_88.y * dVar10 - dVar9 * local_88.z) * 0.49999999999999994 +
               dVar17 * -0.8660254037844387 + dVar15;
  local_88.y = (local_88.z * dVar17 - dVar13) * 0.49999999999999994 +
               dVar9 * -0.8660254037844387 + dVar16;
  local_88.z = (dVar11 - dVar12) * 0.49999999999999994 + (dVar14 - dVar10 * 0.8660254037844387);
  glBegin(3);
  glVertex3dv(&local_48);
  glVertex3dv(&local_68);
  glVertex3dv(&local_88);
  glEnd();
  pDVar8 = get_draw_style(this,&h->super_HalfedgeElement);
  DrawStyle::style_reset(pDVar8);
  return;
}

Assistant:

void Mesh::draw_halfedge_arrow(const Halfedge *h) const {
  get_draw_style(h)->style_halfedge();

  const Vector3D& p0 = h->vertex()->position;
  const Vector3D& p1 = h->next()->vertex()->position;
  const Vector3D& p2 = h->next()->next()->vertex()->position;

  const Vector3D& e01 = p1-p0;
  const Vector3D& e12 = p2-p1;
  const Vector3D& e20 = p0-p2;

  const Vector3D& u = (e01 - e20) / 2;
  const Vector3D& v = (e12 - e01) / 2;

  const Vector3D& a = p0 + u / 5;
  const Vector3D& b = p1 + v / 5;

  const Vector3D& s = (b-a) / 5;
  const Vector3D& t = cross(h->face()->normal(), s);
  double theta = PI * 5 / 6;
  const Vector3D& c = b + cos(theta) * s + sin(theta) * t;

  glBegin(GL_LINE_STRIP);
  glVertex3dv(&a.x);
  glVertex3dv(&b.x);
  glVertex3dv(&c.x);
  glEnd();

  get_draw_style(h)->style_reset();
}